

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCubicSpline.cpp
# Opt level: O2

void __thiscall
chrono::ChCubicSpline::Evaluate(ChCubicSpline *this,double t,double *y,double *yp,double *ypp)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if (this->m_process == true) {
    Process(this);
  }
  pdVar3 = (this->m_t).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*pdVar3 <= t) {
    lVar10 = (long)(this->m_t).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3;
    if (t <= *(double *)((long)pdVar3 + lVar10 + -8)) {
      for (uVar9 = 1; (uVar9 < (ulong)(lVar10 >> 3) && (pdVar3[uVar9] < t)); uVar9 = uVar9 + 1) {
      }
      pdVar4 = (this->m_ypp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->m_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = pdVar4[uVar9 - 1];
      dVar2 = pdVar5[uVar9 - 1];
      dVar8 = pdVar3[uVar9] - pdVar3[uVar9 - 1];
      dVar6 = dVar8 * dVar8;
      auVar11._0_8_ = (t - pdVar3[uVar9 - 1]) / dVar8;
      auVar11._8_8_ = 0;
      dVar7 = dVar6 * dVar1 * 0.5;
      dVar13 = (dVar6 * (pdVar4[uVar9] - dVar1)) / 6.0;
      dVar1 = ((pdVar5[uVar9] - dVar2) - dVar13) - dVar7;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = auVar11._0_8_ * dVar13 * auVar11._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = auVar11._0_8_ * dVar7 * auVar11._0_8_;
      auVar12 = vfmadd231sd_fma(auVar19,auVar11,auVar17);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar1;
      auVar12 = vfmadd231sd_fma(auVar12,auVar16,auVar11);
      *y = auVar12._0_8_ + dVar2;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar7 + dVar7;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar13 * 6.0;
      auVar12 = vfmadd213sd_fma(auVar14,auVar11,auVar12);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = auVar11._0_8_ * dVar13 * 3.0;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = auVar11._0_8_ * (dVar7 + dVar7);
      auVar11 = vfmadd231sd_fma(auVar18,auVar11,auVar15);
      *yp = (auVar11._0_8_ + dVar1) / dVar8;
      *ypp = auVar12._0_8_ / dVar6;
      return;
    }
    __assert_fail("t <= m_t[n - 1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChCubicSpline.cpp"
                  ,0x86,"void chrono::ChCubicSpline::Evaluate(double, double &, double &, double &)"
                 );
  }
  __assert_fail("t >= m_t[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChCubicSpline.cpp"
                ,0x85,"void chrono::ChCubicSpline::Evaluate(double, double &, double &, double &)");
}

Assistant:

void ChCubicSpline::Evaluate(double t, double& y, double& yp, double& ypp) {
    if (m_process)
        Process();

    auto n = m_t.size();
    assert(t >= m_t[0]);
    assert(t <= m_t[n - 1]);

    // Bracket the given value: m_t[i_left] < t <= m_t[i_left+1]
    int left = 0;
    for (size_t i = 1; i < n; i++) {
        if (t > m_t[i])
            left++;
        else
            break;
    }

    double dt = m_t[left + 1] - m_t[left];
    double tau = (t - m_t[left]) / dt;
    double a = dt * dt * (m_ypp[left + 1] - m_ypp[left]) / 6;
    double b = dt * dt * m_ypp[left] / 2;
    double c = (m_y[left + 1] - m_y[left]) - a - b;
    double d = m_y[left];

    y = a * tau * tau * tau + b * tau * tau + c * tau + d;
    yp = (3 * a * tau * tau + 2 * b * tau + c) / dt;
    ypp = (6 * a * tau + 2 * b) / (dt * dt);
}